

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::~cmLocalNinjaGenerator(cmLocalNinjaGenerator *this)

{
  cmLocalNinjaGenerator *this_local;
  
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalNinjaGenerator_00a8b3e0;
  std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::~vector
            (&this->CustomCommands);
  std::
  map<const_cmCustomCommand_*,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>,_std::less<const_cmCustomCommand_*>,_std::allocator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>_>
  ::~map(&this->CustomCommandTargets);
  std::__cxx11::string::~string((string *)&this->HomeRelativeOutputPath);
  cmLocalCommonGenerator::~cmLocalCommonGenerator(&this->super_cmLocalCommonGenerator);
  return;
}

Assistant:

cmLocalNinjaGenerator::~cmLocalNinjaGenerator() = default;